

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint getPaletteTranslucency(uchar *palette,size_t palettesize)

{
  long lVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  size_t sVar6;
  uint uVar7;
  
  if (palettesize == 0) {
    return 0;
  }
  uVar3 = '\0';
  uVar4 = '\0';
  uVar5 = '\0';
  uVar7 = 0;
  sVar6 = 0;
  do {
    lVar1 = sVar6 * 4;
    uVar2 = palette[sVar6 * 4 + 3];
    if (uVar7 == 0) {
      uVar7 = 0;
      if (uVar2 != 0xff) {
        if (uVar2 != '\0') {
          return 2;
        }
        uVar5 = palette[lVar1];
        uVar4 = palette[lVar1 + 1];
        uVar3 = palette[lVar1 + 2];
        uVar7 = 1;
        sVar6 = 0xffffffffffffffff;
      }
    }
    else {
      if (uVar2 != 0xff) {
        return 2;
      }
      uVar7 = 1;
      if (((uVar5 == palette[lVar1]) && (uVar4 == palette[lVar1 + 1])) &&
         (uVar3 == palette[lVar1 + 2])) {
        return 2;
      }
    }
    sVar6 = sVar6 + 1;
    if (sVar6 == palettesize) {
      return uVar7;
    }
  } while( true );
}

Assistant:

static unsigned getPaletteTranslucency(const unsigned char* palette, size_t palettesize)
{
	size_t i;
	unsigned key = 0;
	unsigned r = 0, g = 0, b = 0; /*the value of the color with alpha 0, so long as color keying is possible*/
	for (i = 0; i != palettesize; ++i)
	{
		if (!key && palette[4 * i + 3] == 0)
		{
			r = palette[4 * i + 0]; g = palette[4 * i + 1]; b = palette[4 * i + 2];
			key = 1;
			i = (size_t)(-1); /*restart from beginning, to detect earlier opaque colors with key's value*/
		}
		else if (palette[4 * i + 3] != 255) return 2;
		/*when key, no opaque RGB may have key's RGB*/
		else if (key && r == palette[i * 4 + 0] && g == palette[i * 4 + 1] && b == palette[i * 4 + 2]) return 2;
	}
	return key;
}